

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O3

string * __thiscall
absl::lts_20240722::Status::ToStringSlow_abi_cxx11_
          (string *__return_storage_ptr__,Status *this,uintptr_t rep,StatusToStringMode mode)

{
  string local_90;
  undefined8 local_70;
  char *local_68;
  AlphaNum local_40;
  
  if (((ulong)this & 1) == 0) {
    status_internal::StatusRep::ToString_abi_cxx11_
              (__return_storage_ptr__,(StatusRep *)this,(StatusCode)rep);
  }
  else {
    StatusCodeToString_abi_cxx11_(&local_90,(lts_20240722 *)((ulong)this >> 2),(StatusCode)rep);
    local_40.piece_._M_len = local_90._M_string_length;
    local_40.piece_._M_str = local_90._M_dataplus._M_p;
    local_70 = 2;
    local_68 = ": ";
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Status::ToStringSlow(uintptr_t rep, StatusToStringMode mode) {
  if (IsInlined(rep)) {
    return absl::StrCat(absl::StatusCodeToString(InlinedRepToCode(rep)), ": ");
  }
  return RepToPointer(rep)->ToString(mode);
}